

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::error<unsigned_int&,unsigned_int_const&>
          (ValidationContext *this,IssueError *issue,uint *args,uint *args_1)

{
  basic_string_view<char,_std::char_traits<char>_> s;
  underlying_type_t<ktx::ReturnCode> uVar1;
  uint *in_RCX;
  v10 *in_RDX;
  undefined1 *in_RSI;
  ValidationReport *in_RDI;
  undefined1 in_stack_000000d8 [16];
  undefined1 in_stack_000000e8 [16];
  ValidationReport *__args;
  string *psVar2;
  char *pcVar3;
  uint *local_168;
  allocator<char> *in_stack_fffffffffffffea0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  allocator<char> local_141;
  undefined1 local_140;
  undefined2 local_13e;
  char local_138 [32];
  undefined1 auStack_118 [48];
  undefined1 *local_e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  local_d8;
  undefined8 local_b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_b0;
  uint *local_98;
  v10 *local_90;
  uint *local_88 [2];
  ValidationReport *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_70;
  undefined8 *local_68;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int>
  *local_58;
  undefined8 local_50;
  undefined8 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 *local_30;
  uint **local_28;
  uint **local_20;
  undefined8 *local_8;
  
  *(int *)&(in_RDI->details)._M_string_length = (int)(in_RDI->details)._M_string_length + 1;
  auStack_118._32_8_ = in_RCX;
  auStack_118._40_8_ = in_RDX;
  local_e8 = in_RSI;
  uVar1 = ktx::operator+(SUCCESS);
  *(underlying_type_t<ktx::ReturnCode> *)&(in_RDI->details).field_0x4 = uVar1;
  psVar2 = &in_RDI->message;
  local_140 = *local_e8;
  local_13e = *(undefined2 *)(local_e8 + 2);
  pcVar3 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  __args = (ValidationReport *)auStack_118;
  local_30 = (undefined8 *)(local_e8 + 0x18);
  local_28 = &local_168;
  local_40 = *local_30;
  local_38 = *(undefined8 *)(local_e8 + 0x20);
  s._M_str = pcVar3;
  s._M_len = (size_t)psVar2;
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            ((basic_string_view<char> *)in_RDI,s);
  local_8 = local_30;
  local_88[0] = local_168;
  local_90 = (v10 *)auStack_118._40_8_;
  local_98 = (uint *)auStack_118._32_8_;
  local_20 = local_88;
  local_78 = __args;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_int_const>
            (&local_d8,(v10 *)auStack_118._40_8_,(uint *)auStack_118._32_8_,local_168);
  local_68 = &local_b8;
  local_70 = &local_d8;
  local_50 = 0x22;
  local_b8 = 0x22;
  local_60 = local_70;
  local_58 = local_70;
  local_48 = local_68;
  local_b0 = local_70;
  ::fmt::v10::vformat_abi_cxx11_((string_view)in_stack_000000e8,(format_args)in_stack_000000d8);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            ((function<void_(const_ktx::ValidationReport_&)> *)in_RDI,__args);
  ValidationReport::~ValidationReport(in_RDI);
  std::allocator<char>::~allocator(&local_141);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }